

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O3

int Gia_ManSimSimulateEquiv(Gia_Man_t *pAig,Gia_ParSim_t *pPars)

{
  int iVar1;
  uint *puVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Gia_Sim2_t *p;
  Abc_Cex_t *pAVar9;
  uint uVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  Gia_Man_t *p_00;
  Gia_ParSim_t *__s;
  Gia_Man_t *pGVar17;
  ulong uVar18;
  int i;
  ulong uVar19;
  double dVar20;
  timespec ts;
  ulong local_78;
  timespec local_68;
  long local_58;
  Gia_Man_t *local_50;
  long local_48;
  double local_40;
  Gia_ParSim_t *local_38;
  
  iVar5 = clock_gettime(3,&local_68);
  if (iVar5 < 0) {
    local_58 = -1;
  }
  else {
    local_58 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  iVar5 = pPars->TimeLimit;
  if ((long)iVar5 == 0) {
    local_48 = 0;
  }
  else {
    iVar6 = clock_gettime(3,&local_68);
    if (iVar6 < 0) {
      local_48 = -1;
    }
    else {
      local_48 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    local_48 = local_48 + (long)iVar5 * 1000000;
  }
  if ((pAig->pReprs == (Gia_Rpr_t *)0x0) || (pAig->pNexts == (int *)0x0)) {
    __assert_fail("pAig->pReprs && pAig->pNexts",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim2.c"
                  ,0x285,"int Gia_ManSimSimulateEquiv(Gia_Man_t *, Gia_ParSim_t *)");
  }
  if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
    free(pAig->pCexSeq);
    pAig->pCexSeq = (Abc_Cex_t *)0x0;
  }
  p = Gia_Sim2Create(pAig,pPars);
  __s = pPars;
  Gia_ManResetRandom(pPars);
  pGVar17 = p->pAig;
  iVar5 = pGVar17->nRegs;
  if (0 < iVar5) {
    pVVar11 = pGVar17->vCis;
    iVar6 = 0;
    do {
      iVar15 = pVVar11->nSize;
      uVar10 = (iVar15 - iVar5) + iVar6;
      if (((int)uVar10 < 0) || (iVar15 <= (int)uVar10)) {
LAB_00766ca5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar15 = pVVar11->pArray[uVar10];
      if (((long)iVar15 < 0) || (pGVar17->nObjs <= iVar15)) {
LAB_00766c86:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar17->pObjs == (Gia_Obj_t *)0x0) break;
      lVar12 = (long)p->nWords;
      if (0 < lVar12) {
        __s = (Gia_ParSim_t *)(p->pDataSim + (int)pGVar17->pObjs[iVar15].Value * lVar12);
        memset(__s,0,lVar12 << 2);
        iVar5 = pGVar17->nRegs;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < iVar5);
  }
  if (pPars->nIters < 1) {
    iVar5 = 0;
    local_78 = 0;
  }
  else {
    local_40 = (double)local_58;
    local_78 = 0;
    local_50 = pAig;
    local_38 = pPars;
    do {
      if (pGVar17->pObjs->Value != 0) {
        __assert_fail("Gia_ObjValue(pObj) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim2.c"
                      ,0x119,"void Gia_Sim2SimulateRound(Gia_Sim2_t *)");
      }
      uVar10 = p->nWords;
      uVar14 = (ulong)uVar10;
      if (0 < (int)uVar10) {
        __s = (Gia_ParSim_t *)p->pDataSim;
        memset(__s,0,uVar14 * 4);
      }
      iVar5 = pGVar17->nRegs;
      pVVar11 = pGVar17->vCis;
      iVar6 = pVVar11->nSize;
      if (iVar5 < iVar6) {
        lVar12 = 0;
        do {
          iVar15 = (int)__s;
          if (iVar6 <= lVar12) goto LAB_00766ca5;
          iVar6 = pVVar11->pArray[lVar12];
          if (((long)iVar6 < 0) || (pGVar17->nObjs <= iVar6)) goto LAB_00766c86;
          if (pGVar17->pObjs == (Gia_Obj_t *)0x0) goto LAB_00766759;
          if (0 < (int)uVar10) {
            uVar8 = pGVar17->pObjs[iVar6].Value;
            puVar2 = p->pDataSim;
            uVar19 = uVar14 + 1;
            do {
              __s = (Gia_ParSim_t *)0x0;
              uVar7 = Gia_ManRandom(0);
              puVar2[(long)(int)(uVar8 * uVar10) + (uVar19 - 2)] = uVar7;
              uVar19 = uVar19 - 1;
            } while (1 < uVar19);
            iVar5 = pGVar17->nRegs;
            pVVar11 = pGVar17->vCis;
          }
          lVar12 = lVar12 + 1;
          iVar6 = pVVar11->nSize;
        } while (lVar12 < iVar6 - iVar5);
      }
      iVar15 = (int)__s;
      if ((0 < pGVar17->nObjs) && (pGVar3 = pGVar17->pObjs, pGVar3 != (Gia_Obj_t *)0x0)) {
        uVar19 = uVar14 + 1;
        uVar13 = 0;
        do {
          uVar18 = *(ulong *)(pGVar3 + uVar13);
          uVar8 = (uint)uVar18;
          __s = (Gia_ParSim_t *)CONCAT71((int7)((ulong)__s >> 8),(int)uVar8 < 0);
          if ((~uVar8 & 0x1fffffff) != 0 && (int)uVar8 >= 0) {
            uVar7 = pGVar3[uVar13].Value;
            if (uVar13 != uVar7) {
              __assert_fail("Gia_ObjValue(pObj) == i",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim2.c"
                            ,0x11f,"void Gia_Sim2SimulateRound(Gia_Sim2_t *)");
            }
            puVar2 = p->pDataSim;
            iVar5 = uVar10 * uVar7;
            __s = (Gia_ParSim_t *)(puVar2 + (int)((uVar7 - (uVar8 & 0x1fffffff)) * uVar10));
            iVar6 = (uVar7 - ((uint)(uVar18 >> 0x20) & 0x1fffffff)) * uVar10;
            if ((uVar8 >> 0x1d & 1) == 0) {
              if ((uVar18 >> 0x3d & 1) == 0) {
                uVar18 = uVar19;
                if (0 < (int)uVar10) {
                  do {
                    puVar2[(long)iVar5 + (uVar18 - 2)] =
                         puVar2[(long)iVar6 + (uVar18 - 2)] & *(uint *)((long)__s + uVar18 * 4 + -8)
                    ;
                    uVar18 = uVar18 - 1;
                  } while (1 < uVar18);
                }
              }
              else {
                uVar18 = uVar19;
                if (0 < (int)uVar10) {
                  do {
                    puVar2[(long)iVar5 + (uVar18 - 2)] =
                         ~puVar2[(long)iVar6 + (uVar18 - 2)] &
                         *(uint *)((long)__s + uVar18 * 4 + -8);
                    uVar18 = uVar18 - 1;
                  } while (1 < uVar18);
                }
              }
            }
            else if ((uVar18 >> 0x3d & 1) == 0) {
              uVar18 = uVar19;
              if (0 < (int)uVar10) {
                do {
                  puVar2[(long)iVar5 + (uVar18 - 2)] =
                       ~*(uint *)((long)__s + uVar18 * 4 + -8) & puVar2[(long)iVar6 + (uVar18 - 2)];
                  uVar18 = uVar18 - 1;
                } while (1 < uVar18);
              }
            }
            else {
              uVar18 = uVar19;
              if (0 < (int)uVar10) {
                do {
                  puVar2[(long)iVar5 + (uVar18 - 2)] =
                       ~(puVar2[(long)iVar6 + (uVar18 - 2)] | *(uint *)((long)__s + uVar18 * 4 + -8)
                        );
                  uVar18 = uVar18 - 1;
                } while (1 < uVar18);
              }
            }
          }
          iVar15 = (int)__s;
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)pGVar17->nObjs);
      }
LAB_00766759:
      pPars = local_38;
      p_00 = local_50;
      pVVar11 = pGVar17->vCos;
      if (0 < pVVar11->nSize) {
        piVar4 = pVVar11->pArray;
        lVar12 = 0;
        do {
          iVar15 = piVar4[lVar12];
          lVar16 = (long)iVar15;
          if ((lVar16 < 0) || (pGVar17->nObjs <= iVar15)) goto LAB_00766c86;
          pGVar3 = pGVar17->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          puVar2 = p->pDataSim;
          iVar5 = pGVar3[lVar16].Value * uVar10;
          iVar6 = (pGVar3[lVar16].Value - (*(uint *)(pGVar3 + lVar16) & 0x1fffffff)) * uVar10;
          if ((*(uint *)(pGVar3 + lVar16) >> 0x1d & 1) == 0) {
            uVar19 = uVar14 + 1;
            if (0 < (int)uVar10) {
              do {
                puVar2[(long)iVar5 + (uVar19 - 2)] = puVar2[(long)iVar6 + (uVar19 - 2)];
                uVar19 = uVar19 - 1;
              } while (1 < uVar19);
            }
          }
          else {
            uVar19 = uVar14 + 1;
            if (0 < (int)uVar10) {
              do {
                puVar2[(long)iVar5 + (uVar19 - 2)] = ~puVar2[(long)iVar6 + (uVar19 - 2)];
                uVar19 = uVar19 - 1;
              } while (1 < uVar19);
            }
          }
          lVar12 = lVar12 + 1;
          iVar15 = pVVar11->nSize;
        } while (lVar12 < iVar15);
      }
      iVar5 = (int)local_78;
      if (local_38->fVerbose != 0) {
        Abc_Print(iVar15,"Frame %4d out of %4d and timeout %3d sec. ",(ulong)(iVar5 + 1),
                  (ulong)(uint)local_38->nIters);
        if ((p_00->pReprs != (Gia_Rpr_t *)0x0) && (p_00->pNexts != (int *)0x0)) {
          uVar8 = Gia_ManEquivCountLitsAll(p_00);
          Abc_Print((int)p_00,"Lits = %4d. ",(ulong)uVar8);
        }
        iVar15 = 3;
        iVar6 = clock_gettime(3,&local_68);
        dVar20 = -1.0;
        if (-1 < iVar6) {
          dVar20 = (double)(local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000);
        }
        Abc_Print(iVar15,"Time = %7.2f sec\r",(dVar20 - local_40) / 1000000.0);
      }
      pAig = local_50;
      if (pPars->fCheckMiter != 0) {
        uVar8 = pGVar17->vCos->nSize;
        uVar7 = uVar8 - pGVar17->nRegs;
        if (uVar7 != 0 && pGVar17->nRegs <= (int)uVar8) {
          uVar19 = (ulong)uVar8;
          if ((int)uVar8 < 1) {
            uVar19 = 0;
          }
          uVar13 = 0;
LAB_00766914:
          if (uVar13 == uVar19) goto LAB_00766ca5;
          iVar6 = pGVar17->vCos->pArray[uVar13];
          if (((long)iVar6 < 0) || (pGVar17->nObjs <= iVar6)) goto LAB_00766c86;
          if (pGVar17->pObjs != (Gia_Obj_t *)0x0) {
            if (0 < (int)uVar10) {
              iVar15 = 0;
              uVar18 = 0;
              do {
                if (p->pDataSim[(long)(int)(pGVar17->pObjs[iVar6].Value * uVar10) + uVar18] != 0) {
                  uVar8 = 0;
                  goto LAB_0076697e;
                }
                uVar18 = uVar18 + 1;
                iVar15 = iVar15 + -0x20;
              } while (uVar14 != uVar18);
            }
            goto LAB_0076699c;
          }
        }
      }
LAB_007669a8:
      if ((local_50->pReprs != (Gia_Rpr_t *)0x0) && (local_50->pNexts != (int *)0x0)) {
        Gia_Sim2InfoRefineEquivs(p);
      }
      __s = (Gia_ParSim_t *)0x3;
      iVar6 = clock_gettime(3,&local_68);
      if (iVar6 < 0) {
        lVar12 = -1;
      }
      else {
        lVar12 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      if (local_48 < lVar12) {
        local_78 = (ulong)(iVar5 + 1);
        break;
      }
      iVar6 = pPars->nIters;
      if ((iVar5 < iVar6 + -1) && (iVar15 = pGVar17->nRegs, 0 < iVar15)) {
        pVVar11 = pGVar17->vCos;
        iVar6 = 0;
        do {
          iVar1 = pVVar11->nSize;
          uVar8 = (iVar1 - iVar15) + iVar6;
          if (((int)uVar8 < 0) || (iVar1 <= (int)uVar8)) goto LAB_00766ca5;
          iVar1 = pVVar11->pArray[uVar8];
          __s = (Gia_ParSim_t *)(long)iVar1;
          if (((long)__s < 0) || (pGVar17->nObjs <= iVar1)) goto LAB_00766c86;
          pGVar3 = pGVar17->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          iVar1 = pGVar17->vCis->nSize;
          uVar8 = (iVar1 - iVar15) + iVar6;
          if (((int)uVar8 < 0) || (iVar1 <= (int)uVar8)) goto LAB_00766ca5;
          uVar8 = pGVar17->vCis->pArray[uVar8];
          if (((long)(int)uVar8 < 0) || ((uint)pGVar17->nObjs <= uVar8)) goto LAB_00766c86;
          if (0 < (int)uVar10) {
            uVar8 = pGVar3[(int)uVar8].Value;
            puVar2 = p->pDataSim;
            __s = (Gia_ParSim_t *)(puVar2 + (int)(pGVar3[(long)__s].Value * uVar10));
            uVar19 = uVar14 + 1;
            do {
              puVar2[(long)(int)(uVar8 * uVar10) + (uVar19 - 2)] =
                   *(uint *)((long)__s + uVar19 * 4 + -8);
              uVar19 = uVar19 - 1;
            } while (1 < uVar19);
            iVar15 = pGVar17->nRegs;
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < iVar15);
        iVar6 = pPars->nIters;
      }
      local_78 = (ulong)(iVar5 + 1U);
    } while ((int)(iVar5 + 1U) < iVar6);
    iVar5 = 0;
  }
LAB_00766bcd:
  Gia_Sim2Delete(p);
  if (pAig->pCexSeq == (Abc_Cex_t *)0x0) {
    Abc_Print((int)p,"No bug detected after simulating %d frames with %d words.  ",local_78,
              (ulong)(uint)pPars->nWords);
  }
  iVar15 = 3;
  iVar6 = clock_gettime(3,&local_68);
  if (iVar6 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  lVar12 = lVar12 - local_58;
  Abc_Print(iVar15,"%s =","Time");
  Abc_Print(iVar15,"%9.2f sec\n",(double)lVar12 / 1000000.0);
  return iVar5;
  while (uVar8 = uVar8 + 1, uVar8 != 0x20) {
LAB_0076697e:
    if ((p->pDataSim[(long)(int)(pGVar17->pObjs[iVar6].Value * uVar10) + uVar18] >> (uVar8 & 0x1f) &
        1) != 0) goto LAB_00766993;
  }
  uVar8 = 0xffffffff;
LAB_00766993:
  if (-1 < (int)(uVar8 - iVar15)) {
    Gia_ManResetRandom(pPars);
    pAig = local_50;
    pPars->iOutFail = (int)uVar13;
    pGVar17 = local_50;
    pAVar9 = Gia_Sim2GenerateCounter(local_50,iVar5,(int)uVar13,uVar10,uVar8 - iVar15);
    pAig->pCexSeq = pAVar9;
    Abc_Print((int)pGVar17,"Output %d of miter \"%s\" was asserted in frame %d.  ",
              uVar13 & 0xffffffff,pAig->pName,local_78);
    pGVar17 = pAig;
    iVar6 = Gia_ManVerifyCex(pAig,pAig->pCexSeq,0);
    iVar5 = 1;
    if (iVar6 == 0) {
      Abc_Print((int)pGVar17,"\nGenerated counter-example is INVALID.                    ");
    }
    goto LAB_00766bcd;
  }
LAB_0076699c:
  uVar13 = uVar13 + 1;
  if (uVar13 == uVar7) goto LAB_007669a8;
  goto LAB_00766914;
}

Assistant:

int Gia_ManSimSimulateEquiv( Gia_Man_t * pAig, Gia_ParSim_t * pPars )
{
    Gia_Sim2_t * p;
    Gia_Obj_t * pObj;
    abctime clkTotal = Abc_Clock();
    int i, RetValue = 0, iOut, iPat;
    abctime nTimeToStop = pPars->TimeLimit ? pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;
    assert( pAig->pReprs && pAig->pNexts );
    ABC_FREE( pAig->pCexSeq );
    p = Gia_Sim2Create( pAig, pPars );
    Gia_ManResetRandom( pPars );
    Gia_ManForEachRo( p->pAig, pObj, i )
        Gia_Sim2InfoZero( p, Gia_Sim2Data(p, Gia_ObjValue(pObj)) );
    for ( i = 0; i < pPars->nIters; i++ )
    {
        Gia_Sim2SimulateRound( p );
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "Frame %4d out of %4d and timeout %3d sec. ", i+1, pPars->nIters, pPars->TimeLimit );
            if ( pAig->pReprs && pAig->pNexts )
                Abc_Print( 1, "Lits = %4d. ", Gia_ManEquivCountLitsAll(pAig) );
            Abc_Print( 1, "Time = %7.2f sec\r", (1.0*Abc_Clock()-clkTotal)/CLOCKS_PER_SEC );
        }
        if ( pPars->fCheckMiter && Gia_Sim2CheckPos( p, &iOut, &iPat ) )
        {
            Gia_ManResetRandom( pPars );
            pPars->iOutFail = iOut;
            pAig->pCexSeq = Gia_Sim2GenerateCounter( pAig, i, iOut, p->nWords, iPat );
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", iOut, pAig->pName, i );
            if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            {
//                Abc_Print( 1, "\n" );
                Abc_Print( 1, "\nGenerated counter-example is INVALID.                    " );
//                Abc_Print( 1, "\n" );
            }
            else
            {
//                Abc_Print( 1, "\n" );
//                if ( pPars->fVerbose )
//                Abc_Print( 1, "\nGenerated counter-example is verified correctly.         " );
//                Abc_Print( 1, "\n" );
            }
            RetValue = 1;
            break;
        }
        if ( pAig->pReprs && pAig->pNexts )
            Gia_Sim2InfoRefineEquivs( p );
        if ( Abc_Clock() > nTimeToStop )
        {
            i++;
            break;
        }
        if ( i < pPars->nIters - 1 )
            Gia_Sim2InfoTransfer( p );
    }
    Gia_Sim2Delete( p );
    if ( pAig->pCexSeq == NULL )
        Abc_Print( 1, "No bug detected after simulating %d frames with %d words.  ", i, pPars->nWords );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    return RetValue;
}